

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O0

bool __thiscall Button::onPointerEvent(Button *this,PointerEvent *e)

{
  bool bVar1;
  Type TVar2;
  vec2 p;
  rect2d local_30;
  PointerEvent *local_20;
  PointerEvent *e_local;
  Button *this_local;
  
  local_20 = e;
  e_local = (PointerEvent *)this;
  TVar2 = rengine::Event::type(&e->super_Event);
  if (TVar2 == PointerDown) {
    setState(this,PressedState);
  }
  else {
    TVar2 = rengine::Event::type(&local_20->super_Event);
    if (TVar2 == PointerUp) {
      setState(this,HoveredState);
      rengine::Signal<>::emit(&onClicked,(SignalEmitter *)this);
    }
    else {
      TVar2 = rengine::Event::type(&local_20->super_Event);
      if (TVar2 == PointerMove) {
        local_30 = rengine::RectangleNodeBase::geometry(&this->super_RectangleNodeBase);
        p = rengine::PointerEvent::position(local_20);
        bVar1 = rengine::rect2d::contains(&local_30,p);
        if (!bVar1) {
          rengine::StandardSurface::setPointerEventReceiver(this->m_surface,(Node *)0x0);
          setState(this,DefaultState);
          return false;
        }
        rengine::StandardSurface::setPointerEventReceiver(this->m_surface,(Node *)this);
        setState(this,HoveredState);
      }
    }
  }
  return true;
}

Assistant:

bool Button::onPointerEvent(PointerEvent *e)
{
    if (e->type() == Event::PointerDown) {
        setState(PressedState);
    } else if (e->type() == Event::PointerUp) {
        setState(HoveredState);
        onClicked.emit(this);
    } else if (e->type() == Event::PointerMove) {
        if (geometry().contains(e->position())) {
            m_surface->setPointerEventReceiver(this);
            setState(HoveredState);
        } else {
            m_surface->setPointerEventReceiver(nullptr);
            setState(DefaultState);
            return false;
        }
    }

    return true;
}